

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

void __thiscall libtorrent::aux::bt_peer_connection::write_have_none(bt_peer_connection *this)

{
  undefined1 *puVar1;
  
  puVar1 = &(this->super_peer_connection).field_0x889;
  *puVar1 = *puVar1 | 8;
  peer_connection::peer_log(&this->super_peer_connection,outgoing_message,"HAVE_NONE");
  send_message<>(this,msg_have_none,num_outgoing_have_none);
  extension_notify<void(libtorrent::peer_plugin::*)()>(this,0xc1);
  return;
}

Assistant:

void bt_peer_connection::write_have_none()
	{
		INVARIANT_CHECK;
		m_sent_bitfield = true;
#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::outgoing_message, "HAVE_NONE");
#endif
		send_message(msg_have_none, counters::num_outgoing_have_none);

#ifndef TORRENT_DISABLE_EXTENSIONS
		extension_notify(&peer_plugin::sent_have_none);
#endif
	}